

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

CURLcode Curl_parse_interface(char *input,char **dev,char **iface,char **host)

{
  byte bVar1;
  int iVar2;
  size_t length;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  CURLcode CVar6;
  
  length = strlen(input);
  if (0x200 < length) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  bVar1 = *input;
  iVar2 = bVar1 - 0x69;
  if ((iVar2 == 0) && (iVar2 = (byte)input[1] - 0x66, iVar2 == 0)) {
    iVar2 = 0x21 - (uint)(byte)input[2];
  }
  else {
    iVar2 = -iVar2;
  }
  if (iVar2 == 0) {
    if (input[3] == '\0') {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    pcVar3 = (char *)Curl_memdup0(input + 3,length - 3);
    *iface = pcVar3;
  }
  else {
    iVar2 = strncmp("host!",input,5);
    if (iVar2 == 0) {
      if (input[5] == '\0') {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      pcVar3 = (char *)Curl_memdup0(input + 5,length - 5);
      *host = pcVar3;
    }
    else {
      iVar2 = strncmp("ifhost!",input,7);
      if (iVar2 == 0) {
        pcVar3 = input + 7;
        pvVar4 = memchr(pcVar3,0x21,length - 7);
        if (pvVar4 == (void *)0x0) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        if (*(char *)((long)pvVar4 + 1) == '\0') {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pcVar5 = (char *)Curl_memdup0(pcVar3,(long)pvVar4 - (long)pcVar3);
        *iface = pcVar5;
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar3 = (char *)Curl_memdup0((char *)((long)pvVar4 + 1),
                                      (size_t)(pcVar3 + ((length - 7) - ((long)pvVar4 + 1))));
        *host = pcVar3;
        if (pcVar3 != (char *)0x0) {
          return CURLE_OK;
        }
        (*Curl_cfree)(*iface);
        *iface = (char *)0x0;
        return CURLE_OUT_OF_MEMORY;
      }
      if (bVar1 == 0) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      pcVar3 = (char *)Curl_memdup0(input,length);
      *dev = pcVar3;
    }
  }
  CVar6 = CURLE_OUT_OF_MEMORY;
  if (pcVar3 != (char *)0x0) {
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_parse_interface(const char *input,
                              char **dev, char **iface, char **host)
{
  static const char if_prefix[] = "if!";
  static const char host_prefix[] = "host!";
  static const char if_host_prefix[] = "ifhost!";
  size_t len;

  DEBUGASSERT(dev);
  DEBUGASSERT(iface);
  DEBUGASSERT(host);

  len = strlen(input);
  if(len > 512)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(!strncmp(if_prefix, input, strlen(if_prefix))) {
    input += strlen(if_prefix);
    if(!*input)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    *iface = Curl_memdup0(input, len - strlen(if_prefix));
    return *iface ? CURLE_OK : CURLE_OUT_OF_MEMORY;
  }
  else if(!strncmp(host_prefix, input, strlen(host_prefix))) {
    input += strlen(host_prefix);
    if(!*input)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    *host = Curl_memdup0(input, len - strlen(host_prefix));
    return *host ? CURLE_OK : CURLE_OUT_OF_MEMORY;
  }
  else if(!strncmp(if_host_prefix, input, strlen(if_host_prefix))) {
    const char *host_part;
    input += strlen(if_host_prefix);
    len -= strlen(if_host_prefix);
    host_part = memchr(input, '!', len);
    if(!host_part || !*(host_part + 1))
      return CURLE_BAD_FUNCTION_ARGUMENT;
    *iface = Curl_memdup0(input, host_part - input);
    if(!*iface)
      return CURLE_OUT_OF_MEMORY;
    ++host_part;
    *host = Curl_memdup0(host_part, len - (host_part - input));
    if(!*host) {
      free(*iface);
      *iface = NULL;
      return CURLE_OUT_OF_MEMORY;
    }
    return CURLE_OK;
  }

  if(!*input)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  *dev = Curl_memdup0(input, len);
  return *dev ? CURLE_OK : CURLE_OUT_OF_MEMORY;
}